

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

Node * makeVariable(char *name)

{
  int iVar1;
  Node *pNVar2;
  char *pcVar3;
  Node *local_20;
  Node *node;
  char *name_local;
  
  if (thisRule == (Node *)0x0) {
    __assert_fail("thisRule",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x66,"Node *makeVariable(char *)");
  }
  local_20 = (thisRule->rule).variables;
  while( true ) {
    if (local_20 == (Node *)0x0) {
      pNVar2 = _newNode(2,0x30);
      pcVar3 = strdup(name);
      (pNVar2->rule).name = pcVar3;
      (pNVar2->rule).next = (thisRule->rule).variables;
      (thisRule->rule).variables = pNVar2;
      return pNVar2;
    }
    iVar1 = strcmp(name,(local_20->rule).name);
    if (iVar1 == 0) break;
    local_20 = (local_20->rule).next;
  }
  return local_20;
}

Assistant:

Node *makeVariable(char *name)
{
  Node *node;
  assert(thisRule);
  for (node= thisRule->rule.variables;  node;  node= node->variable.next)
    if (!strcmp(name, node->variable.name))
      return node;
  node= newNode(Variable);
  node->variable.name= strdup(name);
  node->variable.next= thisRule->rule.variables;
  thisRule->rule.variables= node;
  return node;
}